

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# op_helper.c
# Opt level: O2

uint64_t helper_dvstep(uint64_t r1,uint32_t r2)

{
  uint32_t uVar1;
  uint32_t uVar2;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  uint32_t uVar6;
  uint32_t uVar7;
  int iVar8;
  bool bVar9;
  
  uVar1 = extract32(r2,0x1f,1);
  uVar6 = -(int)((long)r1 >> 0x3f);
  uVar7 = -r2;
  if (uVar1 != uVar6) {
    uVar7 = r2;
  }
  uVar5 = r1 >> 0x20;
  iVar8 = 8;
  while( true ) {
    bVar9 = iVar8 == 0;
    iVar8 = iVar8 + -1;
    if (bVar9) break;
    uVar2 = extract32((uint32_t)r1,0x1f,1);
    uVar3 = uVar2 | (int)uVar5 * 2;
    uVar4 = uVar3 + uVar7;
    bVar9 = uVar4 >> 0x1f == uVar6;
    if (!bVar9) {
      uVar4 = uVar3;
    }
    uVar5 = (ulong)uVar4;
    r1 = (uint64_t)((uint)(bVar9 != (uVar1 != uVar6)) + (uint32_t)r1 * 2);
  }
  return r1 & 0xffffffff | uVar5 << 0x20;
}

Assistant:

uint64_t helper_dvstep(uint64_t r1, uint32_t r2)
{
    int32_t dividend_sign = extract64(r1, 63, 1);
    int32_t divisor_sign = extract32(r2, 31, 1);
    int32_t quotient_sign = (dividend_sign != divisor_sign);
    int32_t addend, dividend_quotient, remainder;
    int32_t i, temp;

    if (quotient_sign) {
        addend = r2;
    } else {
        addend = -r2;
    }
    dividend_quotient = (int32_t)r1;
    remainder = (int32_t)(r1 >> 32);

    for (i = 0; i < 8; i++) {
        remainder = (remainder << 1) | extract32(dividend_quotient, 31, 1);
        dividend_quotient <<= 1;
        temp = remainder + addend;
        if ((temp < 0) == dividend_sign) {
            remainder = temp;
        }
        if (((temp < 0) == dividend_sign)) {
            dividend_quotient = dividend_quotient | !quotient_sign;
        } else {
            dividend_quotient = dividend_quotient | quotient_sign;
        }
    }
    return ((uint64_t)remainder << 32) | (uint32_t)dividend_quotient;
}